

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  istream *piVar1;
  ostream *poVar2;
  ulong uVar3;
  long STEPS;
  long lVar4;
  long lVar5;
  long in_R9;
  long lVar6;
  ulong uVar7;
  long i;
  long lVar8;
  long in_stack_fffffffffffffd28;
  Sol best_sol;
  long e_time;
  long s_time;
  long yend;
  long steps;
  long bonus;
  long nrides;
  long vehs;
  Sol sol;
  vector<ride,_std::allocator<ride>_> rides;
  long cols;
  long rows;
  long xstart;
  
  piVar1 = std::istream::_M_extract<long>(&std::cin);
  piVar1 = std::istream::_M_extract<long>((long *)piVar1);
  piVar1 = std::istream::_M_extract<long>((long *)piVar1);
  piVar1 = std::istream::_M_extract<long>((long *)piVar1);
  piVar1 = std::istream::_M_extract<long>((long *)piVar1);
  std::istream::_M_extract<long>((long *)piVar1);
  std::vector<ride,_std::allocator<ride>_>::vector(&rides,nrides,(allocator_type *)&xstart);
  lVar6 = 0x38;
  for (lVar8 = 0; lVar8 < nrides; lVar8 = lVar8 + 1) {
    piVar1 = std::istream::_M_extract<long>(&std::cin);
    piVar1 = std::istream::_M_extract<long>((long *)piVar1);
    piVar1 = std::istream::_M_extract<long>((long *)piVar1);
    piVar1 = std::istream::_M_extract<long>((long *)piVar1);
    piVar1 = std::istream::_M_extract<long>((long *)piVar1);
    std::istream::_M_extract<long>((long *)piVar1);
    lVar4 = xstart - (long)best_sol.
                           super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = -lVar4;
    if (0 < lVar4) {
      lVar5 = lVar4;
    }
    lVar4 = (long)sol.
                  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start - yend;
    in_R9 = -lVar4;
    if (0 < lVar4) {
      in_R9 = lVar4;
    }
    in_R9 = in_R9 + lVar5;
    *(long *)((long)rides.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar6 + -0x38) = lVar8;
    *(long *)((long)rides.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar6 + -0x30) = s_time;
    *(long *)((long)rides.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar6 + -0x28) = e_time;
    *(long *)((long)rides.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar6 + -0x20) = in_R9;
    *(long *)((long)rides.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar6 + -0x18) = xstart;
    *(pointer *)
     ((long)rides.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.super__Vector_impl_data.
            _M_start + lVar6 + -0x10) =
         sol.
         super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)rides.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.super__Vector_impl_data.
            _M_start + lVar6 + -8) =
         best_sol.
         super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(long *)((long)&(rides.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                      super__Vector_impl_data._M_start)->id + lVar6) = yend;
    lVar6 = lVar6 + 0x40;
  }
  sol.
  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sol.
  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sol.
  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  best_sol.
  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  best_sol.
  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  best_sol.
  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = 0;
  for (lVar6 = 0; lVar6 != 0x1e; lVar6 = lVar6 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"iteration: ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2,", threshold: ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    earliestStart((Sol *)&xstart,&rides,vehs,steps,lVar6,in_R9,in_stack_fffffffffffffd28);
    std::
    vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ::_M_move_assign(&sol,(ostream *)&xstart);
    std::
    vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ::~vector((vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
               *)&xstart);
    uVar3 = simulate(&sol,bonus,STEPS);
    if (uVar7 < uVar3) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Improved: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,"->");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::
      vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
      ::operator=(&best_sol,&sol);
      std::ofstream::ofstream((ostream *)&xstart);
      poVar2 = std::operator<<((ostream *)&std::cerr,"Writing to file");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::ofstream::open((char *)&xstart,0x1041bd);
      print_assignments(&best_sol,(ostream *)&xstart);
      std::ofstream::close();
      std::ofstream::~ofstream((ostream *)&xstart);
      uVar7 = uVar3;
    }
  }
  print_assignments(&best_sol,(ostream *)&std::cout);
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::~vector(&best_sol);
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::~vector(&sol);
  std::_Vector_base<ride,_std::allocator<ride>_>::~_Vector_base
            (&rides.super__Vector_base<ride,_std::allocator<ride>_>);
  return 0;
}

Assistant:

int main() {
    long rows, cols, vehs, nrides, bonus, steps;
    cin >> rows >> cols >> vehs >> nrides >> bonus >> steps;

    vector<ride> rides(nrides);
    for (long i = 0; i < nrides; i++) {
        long xstart, ystart, xend, yend, s_time, e_time;
        cin >> xstart >> ystart >> xend >> yend >> s_time >> e_time;
        pt start{xstart, ystart};
        pt end{xend, yend};
        long len = dist(start, end);
        rides[i] = ride {i, s_time, e_time, len, start, end};
    }



    Sol sol;
//    if (nrides == 3 && vehs == 2 && rows == 3 && cols == 4) {
//        sol = exampleA(rides, vehs);
//    } else if (rows == 800 && cols == 1000 && bonus == 25 && steps == 25000) {
        // TODO: ex B
//    }

    Sol best_sol;
    ulong best_pts = 0;
    for (long i = 0; i < 30; i++) {
//        long THRESHOLD = 9 + (rand() % static_cast<int>(16 - 9 + 1));
        long THRESHOLD = i;
        cerr << "iteration: " << i << ", threshold: " << THRESHOLD << endl;
        sol = earliestStart(rides, vehs, steps, THRESHOLD, rows, cols);
        ulong pts = simulate(sol, bonus, steps); // print points
        if (pts > best_pts) {
            cerr << "Improved: " << best_pts << "->" << pts << endl;
            best_pts = pts;
            best_sol = sol;

            ofstream f;
            cerr << "Writing to file" << endl;
            f.open("/tmp/res.txt");
            print_assignments(best_sol, f);
            f.close();
        }
    }

    print_assignments(best_sol, cout);

    return 0;
}